

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_WriteObjectTag(BCWriterState *s,JSValue obj)

{
  JSShape *sh_00;
  BOOL BVar1;
  int iVar2;
  long in_RSI;
  undefined8 *in_RDI;
  JSAtom atom;
  int pass;
  JSShapeProperty *pr;
  JSShape *sh;
  uint32_t prop_count;
  uint32_t i;
  JSObject *p;
  undefined1 in_stack_ffffffffffffffa8 [16];
  int local_44;
  JSShapeProperty *local_40;
  uint local_2c;
  
  bc_put_u8(in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8[7]);
  sh_00 = *(JSShape **)(in_RSI + 0x18);
  local_44 = 0;
  do {
    if (1 < local_44) {
      return 0;
    }
    if (local_44 == 1) {
      bc_put_leb128(in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._4_4_);
    }
    local_2c = 0;
    local_40 = get_shape_prop(sh_00);
    for (; local_2c < (uint)sh_00->prop_count; local_2c = local_2c + 1) {
      if (((local_40->atom != 0) &&
          (BVar1 = JS_AtomIsString(in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._4_4_),
          BVar1 != 0)) && ((*(uint *)local_40 >> 0x1a & 4) != 0)) {
        if ((*(uint *)local_40 >> 0x1a & 0x30) != 0) {
          JS_ThrowTypeError((JSContext *)*in_RDI,"only value properties are supported");
          return -1;
        }
        if (local_44 != 0) {
          bc_put_atom(in_stack_ffffffffffffffa8._0_8_,0);
          iVar2 = JS_WriteObjectRec((BCWriterState *)pr,_sh);
          if (iVar2 != 0) {
            return -1;
          }
        }
      }
      local_40 = local_40 + 1;
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

static int JS_WriteObjectTag(BCWriterState *s, JSValueConst obj)
{
    JSObject *p = JS_VALUE_GET_OBJ(obj);
    uint32_t i, prop_count;
    JSShape *sh;
    JSShapeProperty *pr;
    int pass;
    JSAtom atom;

    bc_put_u8(s, BC_TAG_OBJECT);
    prop_count = 0;
    sh = p->shape;
    for(pass = 0; pass < 2; pass++) {
        if (pass == 1)
            bc_put_leb128(s, prop_count);
        for(i = 0, pr = get_shape_prop(sh); i < sh->prop_count; i++, pr++) {
            atom = pr->atom;
            if (atom != JS_ATOM_NULL &&
                JS_AtomIsString(s->ctx, atom) &&
                (pr->flags & JS_PROP_ENUMERABLE)) {
                if (pr->flags & JS_PROP_TMASK) {
                    JS_ThrowTypeError(s->ctx, "only value properties are supported");
                    goto fail;
                }
                if (pass == 0) {
                    prop_count++;
                } else {
                    bc_put_atom(s, atom);
                    if (JS_WriteObjectRec(s, p->prop[i].u.value))
                        goto fail;
                }
            }
        }
    }
    return 0;
 fail:
    return -1;
}